

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O3

bool __thiscall helics::MessageFederateManager::hasMessage(MessageFederateManager *this)

{
  bool bVar1;
  __int_type_conflict _Var2;
  _Elt_pointer pEVar3;
  EndpointData *mq;
  _Elt_pointer pEVar4;
  _Map_pointer ppEVar5;
  pthread_rwlock_t *__rwlock;
  byte bVar6;
  _Elt_pointer pEVar7;
  
  bVar1 = (this->eptData).enabled;
  if (bVar1 == true) {
    __rwlock = (pthread_rwlock_t *)&(this->eptData).m_mutex;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&__rwlock->__data);
  }
  else {
    __rwlock = (pthread_rwlock_t *)0x0;
  }
  pEVar4 = (this->eptData).m_obj.
           super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pEVar3 = (this->eptData).m_obj.
           super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pEVar4 == pEVar3) {
    bVar6 = 0;
  }
  else {
    pEVar7 = (this->eptData).m_obj.
             super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppEVar5 = (this->eptData).m_obj.
              super__Deque_base<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      _Var2 = (pEVar4->messages).queueEmptyFlag._M_base._M_i;
      if ((_Var2 & 1U) == 0) break;
      pEVar4 = pEVar4 + 1;
      if (pEVar4 == pEVar7) {
        pEVar4 = ppEVar5[1];
        ppEVar5 = ppEVar5 + 1;
        pEVar7 = pEVar4 + 3;
      }
    } while (pEVar4 != pEVar3);
    bVar6 = _Var2 ^ 1;
  }
  if (bVar1 != false) {
    pthread_rwlock_unlock(__rwlock);
  }
  return (bool)(bVar6 & 1);
}

Assistant:

bool MessageFederateManager::hasMessage() const
{
    auto eptDat = eptData.lock_shared();
    for (const auto& mq : eptDat) {
        if (!mq.messages.empty()) {
            return true;
        }
    }
    return false;
}